

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QRect __thiscall QRenderRule::originRect(QRenderRule *this,QRect *rect,Origin origin)

{
  QRect QVar1;
  
  if (origin == Origin_Content) {
    QVar1 = contentsRect(this,rect);
  }
  else if (origin == Origin_Border) {
    QVar1 = borderRect(this,rect);
  }
  else if (origin == Origin_Padding) {
    QVar1 = paddingRect(this,rect);
  }
  else {
    QVar1 = *rect;
  }
  return QVar1;
}

Assistant:

QRect QRenderRule::originRect(const QRect &rect, Origin origin) const
{
    switch (origin) {
    case Origin_Padding:
        return paddingRect(rect);
    case Origin_Border:
        return borderRect(rect);
    case Origin_Content:
        return contentsRect(rect);
    case Origin_Margin:
    default:
        return rect;
    }
}